

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomUpdateView.cpp
# Opt level: O0

void __thiscall RoomUpdateView::display(RoomUpdateView *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  RoomCreateUpdateForm *this_00;
  undefined4 extraout_var;
  ostream *poVar4;
  Controller *this_01;
  View *pVVar5;
  allocator local_b9;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Room *local_28;
  Room *room;
  int local_18;
  bool video;
  int iStack_14;
  bool audio;
  int strength;
  int roomNumber;
  RoomUpdateView *this_local;
  
  _strength = this;
  std::operator<<((ostream *)&std::cout,"To update a room fill in the details asked below: \n");
  std::operator<<((ostream *)&std::cout,"Enter room number: ");
  iStack_14 = Input::getInt();
  std::operator<<((ostream *)&std::cout,"Enter strength: ");
  local_18 = Input::getInt();
  std::operator<<((ostream *)&std::cout,"Audio required? (y/n): ");
  cVar1 = Input::getChar();
  room._7_1_ = cVar1 == 'y';
  std::operator<<((ostream *)&std::cout,"Video required? (y/n): ");
  cVar1 = Input::getChar();
  room._6_1_ = cVar1 == 'y';
  local_28 = Room::findByRoomNumber(iStack_14);
  if (local_28 == (Room *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"The room #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iStack_14);
    std::operator<<(poVar4," doesn\'t exist.\n");
  }
  else {
    this_00 = (RoomCreateUpdateForm *)operator_new(0x38);
    RoomCreateUpdateForm::RoomCreateUpdateForm
              (this_00,iStack_14,local_18,(bool)(room._7_1_ & 1),(bool)(room._6_1_ & 1),local_28);
    (this->super_UpdateView<Room>).form = (ModelForm<Room> *)this_00;
    bVar2 = Form::isValid(&((this->super_UpdateView<Room>).form)->super_Form);
    if (bVar2) {
      iVar3 = (*(((this->super_UpdateView<Room>).form)->super_Form)._vptr_Form[1])();
      local_28 = (Room *)CONCAT44(extraout_var,iVar3);
      iVar3 = Room::getRoomNumber(local_28);
      std::__cxx11::to_string(&local_98,iVar3);
      std::operator+(&local_78,"Room #",&local_98);
      std::operator+(&local_58,&local_78," updated successfully.\n");
      std::operator<<((ostream *)&std::cout,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      Form::printErrors(&((this->super_UpdateView<Room>).form)->super_Form);
    }
  }
  this_01 = Controller::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"admin-panel",&local_b9);
  pVVar5 = Controller::getView(this_01,&local_b8);
  View::response->view = pVVar5;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

void RoomUpdateView::display() {
    cout << "To update a room fill in the details asked below: \n";
    int roomNumber, strength;
    bool audio, video;
    cout << "Enter room number: ";
    roomNumber = Input::getInt();
    cout << "Enter strength: ";
    strength = Input::getInt();
    cout << "Audio required? (y/n): ";
    audio = (Input::getChar() == 'y');
    cout << "Video required? (y/n): ";
    video = (Input::getChar() == 'y');
    Room *room = Room::findByRoomNumber(roomNumber);
    if (room) {
        form = new RoomCreateUpdateForm(roomNumber, strength, audio, video, room);
        if (form->isValid()) {
            room = &form->save();
            cout << "Room #" + to_string(room->getRoomNumber()) + " updated successfully.\n";
        } else {
            form->printErrors();
        }
    } else {
        cout << "The room #" << roomNumber << " doesn't exist.\n";
    }
    response->view = Controller::getInstance().getView("admin-panel");
}